

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O2

void __thiscall Fl_RGB_Image::uncache(Fl_RGB_Image *this)

{
  if (this->id_ != 0) {
    XFreePixmap(fl_display);
    this->id_ = 0;
  }
  if ((ulong)this->mask_ != 0) {
    fl_delete_bitmask((ulong)this->mask_);
    this->mask_ = 0;
  }
  return;
}

Assistant:

void Fl_RGB_Image::uncache() {
#ifdef __APPLE__
  if (id_) {
    if (mask_) *(bool*)mask_ = false;
    CGImageRelease((CGImageRef)id_);
    id_ = 0;
    mask_ = NULL;
  }
#else
  if (id_) {
    fl_delete_offscreen((Fl_Offscreen)id_);
    id_ = 0;
  }

  if (mask_) {
    fl_delete_bitmask((Fl_Bitmask)mask_);
    mask_ = 0;
  }
#endif
}